

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvlat1.cpp
# Opt level: O0

void ucnv_ASCIIFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                       UErrorCode *pErrorCode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  uint8_t *puVar17;
  bool bVar18;
  int iVar19;
  uint8_t *puVar20;
  byte *pbVar21;
  int iStack_48;
  uint8_t oredChars;
  int32_t loops;
  int32_t count;
  int iStack_3c;
  uint8_t c;
  int32_t length;
  int32_t targetCapacity;
  uint8_t *target;
  uint8_t *sourceLimit;
  uint8_t *source;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pToUArgs_local;
  UConverterFromUnicodeArgs *pFromUArgs_local;
  
  if (pToUArgs->converter->toULength < '\x01') {
    sourceLimit = (uint8_t *)pToUArgs->source;
    puVar17 = (uint8_t *)pToUArgs->sourceLimit;
    _length = (byte *)pFromUArgs->target;
    iStack_3c = (int)pFromUArgs->targetLimit - (int)pFromUArgs->target;
    iVar19 = (int)puVar17 - (int)sourceLimit;
    if (iVar19 < iStack_3c) {
      iStack_3c = iVar19;
    }
    if (0xf < iStack_3c) {
      iStack_48 = iStack_3c >> 4;
      do {
        bVar1 = *sourceLimit;
        *_length = bVar1;
        bVar2 = sourceLimit[1];
        _length[1] = bVar2;
        bVar3 = sourceLimit[2];
        _length[2] = bVar3;
        bVar4 = sourceLimit[3];
        _length[3] = bVar4;
        bVar5 = sourceLimit[4];
        _length[4] = bVar5;
        bVar6 = sourceLimit[5];
        _length[5] = bVar6;
        bVar7 = sourceLimit[6];
        _length[6] = bVar7;
        bVar8 = sourceLimit[7];
        _length[7] = bVar8;
        bVar9 = sourceLimit[8];
        _length[8] = bVar9;
        bVar10 = sourceLimit[9];
        _length[9] = bVar10;
        bVar11 = sourceLimit[10];
        _length[10] = bVar11;
        bVar12 = sourceLimit[0xb];
        _length[0xb] = bVar12;
        bVar13 = sourceLimit[0xc];
        _length[0xc] = bVar13;
        bVar14 = sourceLimit[0xd];
        _length[0xd] = bVar14;
        bVar15 = sourceLimit[0xe];
        _length[0xe] = bVar15;
        puVar20 = sourceLimit + 0x10;
        bVar16 = sourceLimit[0xf];
        pbVar21 = _length + 0x10;
        _length[0xf] = bVar16;
        if (0x7f < (byte)(bVar1 | bVar2 | bVar3 | bVar4 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9 |
                          bVar10 | bVar11 | bVar12 | bVar13 | bVar14 | bVar15 | bVar16)) break;
        iStack_48 = iStack_48 + -1;
        _length = pbVar21;
        sourceLimit = puVar20;
      } while (0 < iStack_48);
      iStack_3c = iStack_3c + ((iStack_3c >> 4) - iStack_48) * -0x10;
    }
    loops._3_1_ = 0;
    while( true ) {
      bVar18 = false;
      if (0 < iStack_3c) {
        loops._3_1_ = *sourceLimit;
        bVar18 = loops._3_1_ < 0x80;
      }
      if (!bVar18) break;
      sourceLimit = sourceLimit + 1;
      *_length = loops._3_1_;
      iStack_3c = iStack_3c + -1;
      _length = _length + 1;
    }
    if (loops._3_1_ < 0x80) {
      if ((sourceLimit < puVar17) && (pFromUArgs->targetLimit <= _length)) {
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
    }
    else {
      *pErrorCode = U_USING_DEFAULT_WARNING;
    }
    pToUArgs->source = (char *)sourceLimit;
    pFromUArgs->target = (char *)_length;
  }
  else {
    *pErrorCode = U_USING_DEFAULT_WARNING;
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_ASCIIFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                   UConverterToUnicodeArgs *pToUArgs,
                   UErrorCode *pErrorCode) {
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity, length;

    uint8_t c;

    if(pToUArgs->converter->toULength > 0) {
        /* no handling of partial UTF-8 characters here, fall back to pivoting */
        *pErrorCode=U_USING_DEFAULT_WARNING;
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pToUArgs->source;
    sourceLimit=(const uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    /*
     * since the conversion here is 1:1 uint8_t:uint8_t, we need only one counter
     * for the minimum of the sourceLength and targetCapacity
     */
    length=(int32_t)(sourceLimit-source);
    if(length<targetCapacity) {
        targetCapacity=length;
    }

    /* unroll the loop with the most common case */
    if(targetCapacity>=16) {
        int32_t count, loops;
        uint8_t oredChars;

        loops=count=targetCapacity>>4;
        do {
            oredChars=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;

            /* were all 16 entries really valid? */
            if(oredChars>0x7f) {
                /* no, return to the first of these 16 */
                source-=16;
                target-=16;
                break;
            }
        } while(--count>0);
        count=loops-count;
        targetCapacity-=16*count;
    }

    /* conversion loop */
    c=0;
    while(targetCapacity>0 && (c=*source)<=0x7f) {
        ++source;
        *target++=c;
        --targetCapacity;
    }

    if(c>0x7f) {
        /* non-ASCII character, handle in standard converter */
        *pErrorCode=U_USING_DEFAULT_WARNING;
    } else if(source<sourceLimit && target>=(const uint8_t *)pFromUArgs->targetLimit) {
        /* target is full */
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }

    /* write back the updated pointers */
    pToUArgs->source=(const char *)source;
    pFromUArgs->target=(char *)target;
}